

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinstatsindex.cpp
# Opt level: O0

bool LookUpOne(CDBWrapper *db,BlockRef *block,DBVal *result)

{
  bool bVar1;
  void *in_RDX;
  long in_FS_OFFSET;
  pair<uint256,_(anonymous_namespace)::DBVal>_conflict read_out;
  DBHashKey *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  pair<uint256,_(anonymous_namespace)::DBVal>_conflict *in_stack_ffffffffffffff08;
  bool local_cd;
  pair<uint256,_(anonymous_namespace)::DBVal>_conflict *in_stack_ffffffffffffff40;
  DBHashKey *in_stack_ffffffffffffff48;
  CDBWrapper *in_stack_ffffffffffffff50;
  undefined1 auStack_88 [128];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::pair<uint256,_(anonymous_namespace)::DBVal>::
  pair<uint256,_(anonymous_namespace)::DBVal,_true>(in_stack_ffffffffffffff08);
  anon_unknown.dwarf_193474c::DBHeightKey::DBHeightKey((DBHeightKey *)in_stack_fffffffffffffef8,0);
  bVar1 = CDBWrapper::
          Read<(anonymous_namespace)::DBHeightKey,std::pair<uint256,(anonymous_namespace)::DBVal>>
                    (in_stack_ffffffffffffff50,(DBHeightKey *)in_stack_ffffffffffffff48,
                     in_stack_ffffffffffffff40);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    bVar1 = operator==((base_blob<256U> *)in_stack_ffffffffffffff08,
                       (base_blob<256U> *)
                       CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
    if (bVar1) {
      memcpy(in_RDX,auStack_88,0x80);
      local_cd = true;
    }
    else {
      anon_unknown.dwarf_193474c::DBHashKey::DBHashKey
                (in_stack_fffffffffffffef8,(uint256 *)0xf9388d);
      local_cd = CDBWrapper::Read<(anonymous_namespace)::DBHashKey,(anonymous_namespace)::DBVal>
                           (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                            (DBVal *)in_stack_ffffffffffffff40);
    }
  }
  else {
    local_cd = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_cd;
  }
  __stack_chk_fail();
}

Assistant:

static bool LookUpOne(const CDBWrapper& db, const interfaces::BlockRef& block, DBVal& result)
{
    // First check if the result is stored under the height index and the value
    // there matches the block hash. This should be the case if the block is on
    // the active chain.
    std::pair<uint256, DBVal> read_out;
    if (!db.Read(DBHeightKey(block.height), read_out)) {
        return false;
    }
    if (read_out.first == block.hash) {
        result = std::move(read_out.second);
        return true;
    }

    // If value at the height index corresponds to an different block, the
    // result will be stored in the hash index.
    return db.Read(DBHashKey(block.hash), result);
}